

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Problem_CGBG_FF.cpp
# Opt level: O2

double __thiscall
Problem_CGBG_FF::ComputeLocalUtility
          (Problem_CGBG_FF *this,Index hI,Scope *tupleOfAgents,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *actions,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *types)

{
  size_t sVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  size_t sVar4;
  reference pvVar5;
  size_type __n;
  size_type __n_00;
  ulong __n_01;
  uint uVar6;
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 in_ZMM2 [64];
  undefined1 in_XMM3 [16];
  vector<double,_std::allocator<double>_> p_oVec_fl;
  vector<unsigned_int,_std::allocator<unsigned_int>_> oVec_hI;
  allocator_type local_99;
  double local_98;
  double local_90;
  double local_88;
  double local_80;
  _Vector_base<double,_std::allocator<double>_> local_78;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_60;
  undefined1 local_48 [16];
  
  sVar4 = ComputeNumberOfAgentsPresentAtHouse(this,hI,actions);
  FilterObservationsForHouse
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_60,this,hI,tupleOfAgents,
             types);
  __n = this->_m_nrFireLevels;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_78,__n,&local_99);
  uVar6 = 0;
  local_90 = 0.0;
  while( true ) {
    auVar8 = in_ZMM2._0_16_;
    __n_00 = (size_type)uVar6;
    if (this->_m_nrFireLevels <= __n_00) break;
    local_98 = Likelihood(this,(Index)__n,
                          (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_60,uVar6);
    sVar1 = this->_m_nrFireLevels;
    pvVar5 = std::vector<double,_std::allocator<double>_>::at
                       ((vector<double,_std::allocator<double>_> *)&local_78,__n_00);
    auVar8 = vcvtusi2sd_avx512f(in_ZMM2._0_16_,sVar1);
    *pvVar5 = (1.0 / auVar8._0_8_) * local_98;
    pvVar5 = std::vector<double,_std::allocator<double>_>::at
                       ((vector<double,_std::allocator<double>_> *)&local_78,__n_00);
    uVar6 = uVar6 + 1;
    local_90 = local_90 + *pvVar5;
    __n = __n_00;
  }
  local_98 = 0.0;
  bVar3 = Globals::EqualProbability(local_90,0.0);
  if (!bVar3) {
    auVar8 = vcvtusi2sd_avx512f(auVar8,sVar4);
    uVar6 = 0;
    local_88 = auVar8._0_8_;
    local_98 = 0.0;
    while (__n_01 = (ulong)uVar6, __n_01 < this->_m_nrFireLevels) {
      pvVar5 = std::vector<double,_std::allocator<double>_>::at
                         ((vector<double,_std::allocator<double>_> *)&local_78,__n_01);
      dVar7 = *pvVar5;
      if (__n_01 == 0) {
        auVar8 = SUB6416(ZEXT864(0),0) << 0x40;
      }
      else {
        auVar8 = vcvtusi2sd_avx512f(in_XMM3,uVar6);
        auVar2._8_8_ = 0x8000000000000000;
        auVar2._0_8_ = 0x8000000000000000;
        local_48 = vorpd_avx512vl(auVar8,auVar2);
        local_80 = dVar7;
        dVar7 = pow(0.7,local_88);
        auVar8._8_8_ = 0;
        auVar8._0_8_ = dVar7 * (double)local_48._0_8_;
        dVar7 = local_80;
      }
      auVar9._0_8_ = dVar7 / local_90;
      auVar9._8_8_ = 0;
      auVar10._8_8_ = 0;
      auVar10._0_8_ = local_98;
      uVar6 = uVar6 + 1;
      auVar8 = vfmadd231sd_fma(auVar10,auVar8,auVar9);
      local_98 = auVar8._0_8_;
    }
  }
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_78);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_60);
  return local_98;
}

Assistant:

double Problem_CGBG_FF::ComputeLocalUtility( 
        Index hI, 
        const Scope& tupleOfAgents,
        const vector<Index>& actions,
        const vector<Index>& types
        )
{
#if DEBUGUTILS    
    cout << "ComputeLocalUtility( " 
         << "hI=" << hI 
         << ", tupleOfAgents=" << tupleOfAgents
         << ", actions=" << PrintTools::SoftPrintVector(actions)
         << ", types=" << PrintTools::SoftPrintVector(types)
         << endl;
#endif

    size_t nrAgentsPresent = ComputeNumberOfAgentsPresentAtHouse(hI, actions);
    
    //compute the probabilities over the firelevels of this house, given the joint type
    //and compute 
    //      U^e(jt_e,ja_e) = \sum_s_e P(s_e|jt_e) R^e(s_e,ja_e)
    //(where e corresponds to this house hI)
    //
    //However, in this problem we have some simplying assumptions.
    //E.g., extending the example introduced above, for house 2, we have:
    //      U2(t1t2,a1a2) = \sum_s2 P(s2|t1t2) R(s2|a1a2)
    //
    //Here of course  P(s2|t1t2) =  P(s2,t1t2)/ P(t1t2)
    //
    //However <t1,t2> specify multiple observations, only some of which pertain to house 2,
    //let's rewrite <t1t2> = <h21,h22,hx1,hx2> 
    //(where hxi are to observations of agent i about different houses)
    //
    //  P(s2|h21,h22,hx1,hx2) = P(h21,h22,hx1,hx2|s2) P(s2) / P( h21,h22,hx1,hx2 )
    //                        = P(h21|s2)P(h22|s2)P(s2)P(hx1)P(hx2) / (P(hx1)P(hx2)*\sum_{s2} P(h21|s2)P(h22|s2)P(s2) )
    //                        = P(h21|s2)P(h22|s2)P(s2) / \sum_{s2} P(h21|s2)P(h22|s2)P(s2) 
    //                        = P(s2|h21,h22)
    //

    vector<Problem_CGBG_FF::observation_t> oVec_hI = 
        FilterObservationsForHouse(hI, tupleOfAgents, types);

    double p_oVec = 0.0;
    vector<double> p_oVec_fl(_m_nrFireLevels);
    for(Index fl=0; fl < _m_nrFireLevels; fl++)
    {
        p_oVec_fl.at(fl) = Likelihood(hI, oVec_hI, fl) * Prior(hI, fl);
        p_oVec += p_oVec_fl.at(fl);
        //cout << "\tP(oVec, FL="<<fl<<") = " << p_oVec_fl.at(fl) << endl;        
    }
    //cout << "P(oVec)="<< p_oVec << endl;

    double u_jt_ja = 0.0;

    if(EqualProbability(p_oVec,0.0))
        return(0.0);

    for(Index fl=0; fl < _m_nrFireLevels; fl++)
    {
        double p_fl__oVec = p_oVec_fl.at(fl) / p_oVec;
        double u_fl_ja = GetHouseReward(fl, nrAgentsPresent);
        //cout << "\tp_fl__oVec="<<p_fl__oVec<<" u_fl_ja="<<u_fl_ja<<endl;
        u_jt_ja += p_fl__oVec * u_fl_ja;
    }
#if DEBUGUTILS    
    cout << "u_jt_ja="<<u_jt_ja<<endl;
    if(isnan(u_jt_ja))
        abort();
#endif
    return u_jt_ja;
}